

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::HandleJoinerSessionTimer(CommissionerImpl *this,Timer *aTimer)

{
  bool bVar1;
  pointer ppVar2;
  TimePoint *pTVar3;
  ByteArray *aBytes;
  utils *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  ByteArray local_2c0;
  string local_2a8;
  anon_class_1_0_00000001 local_282;
  v10 local_281;
  v10 *local_280;
  char *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator local_249;
  string local_248;
  _Base_ptr local_228;
  _Base_ptr local_220;
  JoinerSession *local_218;
  JoinerSession *session;
  _Self local_208;
  iterator it;
  v10 *local_1f8;
  size_t local_1f0;
  string local_1e8;
  allocator local_1b1;
  string local_1b0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_190;
  time_point now;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_180;
  bool hasNextShot;
  TimePoint nextShot;
  Timer *aTimer_local;
  CommissionerImpl *this_local;
  undefined1 local_150 [16];
  v10 *local_140;
  ulong local_138;
  v10 *local_130;
  size_t sStack_128;
  string *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  string *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  CommissionerImpl **local_80;
  undefined1 *local_78;
  CommissionerImpl **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  CommissionerImpl **local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  nextShot.__d.__r = (duration)(duration)aTimer;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&stack0xfffffffffffffe80);
  now.__d.__r._7_1_ = 0;
  local_190.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"joiner-session",&local_1b1);
  HandleJoinerSessionTimer::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&it._M_node + 6));
  local_b8 = &local_1f8;
  local_c0 = (v10 *)((long)&it._M_node + 7);
  bVar4 = ::fmt::v10::operator()(local_c0);
  local_1f0 = bVar4.size_;
  local_1f8 = (v10 *)bVar4.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_120 = &local_1e8;
  local_130 = local_1f8;
  sStack_128 = local_1f0;
  local_a0 = &local_130;
  local_140 = local_1f8;
  local_138 = local_1f0;
  local_98 = local_140;
  sStack_90 = local_138;
  this_local = (CommissionerImpl *)
               ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                         ();
  local_78 = local_150;
  local_80 = &this_local;
  local_68 = 0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_80;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_138;
  local_70 = local_80;
  local_60 = local_78;
  local_58 = local_80;
  ::fmt::v10::vformat_abi_cxx11_(&local_1e8,local_140,fmt,args);
  Log(kDebug,&local_1b0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
       ::begin(&this->mJoinerSessions);
  do {
    while( true ) {
      session = (JoinerSession *)
                std::
                map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                ::end(&this->mJoinerSessions);
      bVar1 = std::operator!=(&local_208,(_Self *)&session);
      if (!bVar1) {
        if ((now.__d.__r._7_1_ & 1) != 0) {
          Timer::Start((Timer *)nextShot.__d.__r,(TimePoint)tStack_180.__d.__r);
        }
        return;
      }
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>
               ::operator->(&local_208);
      local_218 = &ppVar2->second;
      pTVar3 = JoinerSession::GetExpirationTime(local_218);
      bVar1 = std::chrono::operator>=(&local_190,pTVar3);
      if (!bVar1) break;
      local_228 = local_208._M_node;
      local_220 = (_Base_ptr)
                  std::
                  map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                  ::erase_abi_cxx11_((map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                                      *)&this->mJoinerSessions,local_208._M_node);
      local_208._M_node = local_220;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,"joiner-session",&local_249);
      HandleJoinerSessionTimer::anon_class_1_0_00000001::operator()(&local_282);
      local_a8 = &local_280;
      local_b0 = &local_281;
      bVar4 = ::fmt::v10::operator()(local_b0);
      local_278 = (char *)bVar4.size_;
      local_280 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                ();
      JoinerSession::GetJoinerId(&local_2c0,local_218);
      this_00 = (utils *)&local_2c0;
      utils::Hex_abi_cxx11_(&local_2a8,this_00,aBytes);
      local_c8 = &local_270;
      local_d8 = local_280;
      pcStack_d0 = local_278;
      local_e0 = &local_2a8;
      local_20 = &local_d8;
      local_f0 = local_280;
      local_e8 = local_278;
      local_18 = local_f0;
      pcStack_10 = local_e8;
      local_118[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_e0,(v10 *)this_00,local_c8);
      local_48 = local_100;
      local_50 = local_118;
      local_38 = 0xd;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_50;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_e8;
      local_40 = local_50;
      local_30 = local_48;
      local_28 = local_50;
      ::fmt::v10::vformat_abi_cxx11_(&local_270,local_f0,fmt_00,args_00);
      Log(kInfo,&local_248,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2c0);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
    }
    if ((now.__d.__r._7_1_ & 1) == 0) {
LAB_001ca9f7:
      pTVar3 = JoinerSession::GetExpirationTime(local_218);
      tStack_180.__d.__r = (duration)(pTVar3->__d).__r;
    }
    else {
      pTVar3 = JoinerSession::GetExpirationTime(local_218);
      bVar1 = std::chrono::operator<(pTVar3,&stack0xfffffffffffffe80);
      if (bVar1) goto LAB_001ca9f7;
    }
    now.__d.__r._7_1_ = 1;
    std::
    _Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>
    ::operator++(&local_208,0);
  } while( true );
}

Assistant:

void CommissionerImpl::HandleJoinerSessionTimer(Timer &aTimer)
{
    TimePoint nextShot;
    bool      hasNextShot = false;
    auto      now         = Clock::now();

    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "joiner session timer triggered");

    auto it = mJoinerSessions.begin();
    while (it != mJoinerSessions.end())
    {
        auto &session = it->second;

        if (now >= session.GetExpirationTime())
        {
            it = mJoinerSessions.erase(it);

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session (joiner ID={}) removed",
                     utils::Hex(session.GetJoinerId()));
        }
        else
        {
            if (!hasNextShot || session.GetExpirationTime() < nextShot)
            {
                nextShot = session.GetExpirationTime();
            }
            hasNextShot = true;

            it++;
        }
    }

    if (hasNextShot)
    {
        aTimer.Start(nextShot);
    }
}